

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f Quat4f::fromRotationMatrix(Matrix3f *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  Matrix3f *in_RSI;
  double dVar5;
  Quat4f QVar6;
  Quat4f q;
  float s_3;
  float s_2;
  float s_1;
  float s;
  float onePlusTrace;
  float w;
  float z;
  float y;
  float x;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  Quat4f local_44;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Matrix3f *local_10;
  
  local_10 = in_RSI;
  pfVar4 = Matrix3f::operator()(in_RSI,0,0);
  fVar1 = *pfVar4;
  pfVar4 = Matrix3f::operator()(local_10,1,1);
  fVar2 = *pfVar4;
  pfVar4 = Matrix3f::operator()(local_10,2,2);
  local_24 = fVar1 + 1.0 + fVar2 + *pfVar4;
  if (local_24 <= 1e-05) {
    pfVar4 = Matrix3f::operator()(local_10,0,0);
    fVar1 = *pfVar4;
    pfVar4 = Matrix3f::operator()(local_10,1,1);
    fVar2 = *pfVar4;
    pfVar4 = Matrix3f::operator()(local_10,0,0);
    fVar3 = *pfVar4;
    pfVar4 = Matrix3f::operator()(local_10,2,2);
    if (fVar1 <= fVar2 || fVar3 <= *pfVar4) {
      pfVar4 = Matrix3f::operator()(local_10,1,1);
      fVar1 = *pfVar4;
      pfVar4 = Matrix3f::operator()(local_10,2,2);
      if (fVar1 <= *pfVar4) {
        pfVar4 = Matrix3f::operator()(local_10,2,2);
        fVar1 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,0,0);
        fVar2 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,1,1);
        dVar5 = sqrt((double)(((fVar1 + 1.0) - fVar2) - *pfVar4));
        local_34 = (float)(dVar5 * 2.0);
        pfVar4 = Matrix3f::operator()(local_10,0,2);
        fVar1 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,2,0);
        local_14 = (fVar1 + *pfVar4) / local_34;
        pfVar4 = Matrix3f::operator()(local_10,1,2);
        fVar1 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,2,1);
        local_18 = (fVar1 + *pfVar4) / local_34;
        local_1c = local_34 * 0.25;
        pfVar4 = Matrix3f::operator()(local_10,0,1);
        in_stack_ffffffffffffff58 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,1,0);
        local_20 = (in_stack_ffffffffffffff58 - *pfVar4) / local_34;
      }
      else {
        pfVar4 = Matrix3f::operator()(local_10,1,1);
        in_stack_ffffffffffffff5c = *pfVar4 + 1.0;
        pfVar4 = Matrix3f::operator()(local_10,0,0);
        fVar1 = in_stack_ffffffffffffff5c - *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,2,2);
        dVar5 = sqrt((double)(fVar1 - *pfVar4));
        local_30 = (float)(dVar5 * 2.0);
        pfVar4 = Matrix3f::operator()(local_10,0,1);
        fVar1 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,1,0);
        local_14 = (fVar1 + *pfVar4) / local_30;
        local_18 = local_30 * 0.25;
        pfVar4 = Matrix3f::operator()(local_10,1,2);
        fVar1 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,2,1);
        local_1c = (fVar1 + *pfVar4) / local_30;
        pfVar4 = Matrix3f::operator()(local_10,0,2);
        fVar1 = *pfVar4;
        pfVar4 = Matrix3f::operator()(local_10,2,0);
        local_20 = (fVar1 - *pfVar4) / local_30;
      }
    }
    else {
      pfVar4 = Matrix3f::operator()(local_10,0,0);
      fVar1 = *pfVar4;
      pfVar4 = Matrix3f::operator()(local_10,1,1);
      fVar2 = *pfVar4;
      pfVar4 = Matrix3f::operator()(local_10,2,2);
      dVar5 = sqrt((double)(((fVar1 + 1.0) - fVar2) - *pfVar4));
      local_2c = (float)(dVar5 * 2.0);
      local_14 = local_2c * 0.25;
      pfVar4 = Matrix3f::operator()(local_10,0,1);
      fVar1 = *pfVar4;
      pfVar4 = Matrix3f::operator()(local_10,1,0);
      local_18 = (fVar1 + *pfVar4) / local_2c;
      pfVar4 = Matrix3f::operator()(local_10,0,2);
      fVar1 = *pfVar4;
      pfVar4 = Matrix3f::operator()(local_10,2,0);
      local_1c = (fVar1 + *pfVar4) / local_2c;
      pfVar4 = Matrix3f::operator()(local_10,1,2);
      fVar1 = *pfVar4;
      pfVar4 = Matrix3f::operator()(local_10,2,1);
      local_20 = (fVar1 - *pfVar4) / local_2c;
    }
  }
  else {
    dVar5 = sqrt((double)local_24);
    local_28 = (float)(dVar5 * 2.0);
    pfVar4 = Matrix3f::operator()(local_10,2,1);
    fVar1 = *pfVar4;
    pfVar4 = Matrix3f::operator()(local_10,1,2);
    local_14 = (fVar1 - *pfVar4) / local_28;
    pfVar4 = Matrix3f::operator()(local_10,0,2);
    fVar1 = *pfVar4;
    pfVar4 = Matrix3f::operator()(local_10,2,0);
    local_18 = (fVar1 - *pfVar4) / local_28;
    pfVar4 = Matrix3f::operator()(local_10,1,0);
    fVar1 = *pfVar4;
    pfVar4 = Matrix3f::operator()(local_10,0,1);
    local_1c = (fVar1 - *pfVar4) / local_28;
    local_20 = local_28 * 0.25;
  }
  Quat4f(&local_44,local_20,local_14,local_18,local_1c);
  QVar6 = normalized((Quat4f *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  return (Quat4f)QVar6.m_elements;
}

Assistant:

Quat4f Quat4f::fromRotationMatrix( const Matrix3f& m )
{
	float x;
	float y;
	float z;
	float w;

	// Compute one plus the trace of the matrix
	float onePlusTrace = 1.0f + m( 0, 0 ) + m( 1, 1 ) + m( 2, 2 );

	if( onePlusTrace > 1e-5 )
	{
		// Direct computation
		float s = sqrt( onePlusTrace ) * 2.0f;
		x = ( m( 2, 1 ) - m( 1, 2 ) ) / s;
		y = ( m( 0, 2 ) - m( 2, 0 ) ) / s;
		z = ( m( 1, 0 ) - m( 0, 1 ) ) / s;
		w = 0.25f * s;
	}
	else
	{
		// Computation depends on major diagonal term
		if( ( m( 0, 0 ) > m( 1, 1 ) ) & ( m( 0, 0 ) > m( 2, 2 ) ) )
		{
			float s = sqrt( 1.0f + m( 0, 0 ) - m( 1, 1 ) - m( 2, 2 ) ) * 2.0f;
			x = 0.25f * s;
			y = ( m( 0, 1 ) + m( 1, 0 ) ) / s;
			z = ( m( 0, 2 ) + m( 2, 0 ) ) / s;
			w = ( m( 1, 2 ) - m( 2, 1 ) ) / s;
		}
		else if( m( 1, 1 ) > m( 2, 2 ) )
		{
			float s = sqrt( 1.0f + m( 1, 1 ) - m( 0, 0 ) - m( 2, 2 ) ) * 2.0f;
			x = ( m( 0, 1 ) + m( 1, 0 ) ) / s;
			y = 0.25f * s;
			z = ( m( 1, 2 ) + m( 2, 1 ) ) / s;
			w = ( m( 0, 2 ) - m( 2, 0 ) ) / s;
		}
		else
		{
			float s = sqrt( 1.0f + m( 2, 2 ) - m( 0, 0 ) - m( 1, 1 ) ) * 2.0f;
			x = ( m( 0, 2 ) + m( 2, 0 ) ) / s;
			y = ( m( 1, 2 ) + m( 2, 1 ) ) / s;
			z = 0.25f * s;
			w = ( m( 0, 1 ) - m( 1, 0 ) ) / s;
		}
	}

	Quat4f q( w, x, y, z );
	return q.normalized();
}